

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::anon_unknown_0::RenderCase::init(RenderCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  RenderTarget *pRVar3;
  NotSupportedError *pNVar4;
  undefined4 extraout_var_00;
  TestLog *pTVar5;
  MessageBuilder *this_00;
  ShaderProgram *this_01;
  RenderContext *pRVar6;
  ProgramSources *pPVar7;
  undefined7 extraout_var;
  TestError *this_02;
  allocator<char> local_471;
  string local_470;
  undefined1 local_449;
  string local_448;
  ShaderSource local_428;
  string local_400;
  ShaderSource local_3e0;
  ProgramSources local_3b8;
  MessageBuilder local_2e8;
  undefined1 local_161;
  string local_160;
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  int local_f8;
  undefined1 local_f1;
  GLint maxTexSize;
  string local_d0;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_18;
  int local_14;
  int height;
  int width;
  RenderCase *this_local;
  
  _height = this;
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_14 = tcu::RenderTarget::getWidth(pRVar3);
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_18 = tcu::RenderTarget::getHeight(pRVar3);
  if (this->m_renderTargetType == RENDERTARGETTYPE_SCREEN) {
    if ((local_14 < 0x100) || (local_18 < 0x100)) {
      local_f1 = 1;
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Render target size must be at least ",&local_99);
      de::toString<int>(&local_d0,&Stress::(anonymous_namespace)::TEST_CANVAS_SIZE);
      std::operator+(&local_78,&local_98,&local_d0);
      std::operator+(&local_58,&local_78,"x");
      de::toString<int>((string *)&maxTexSize,&Stress::(anonymous_namespace)::TEST_CANVAS_SIZE);
      std::operator+(&local_38,&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &maxTexSize);
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_38);
      local_f1 = 0;
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  else if (this->m_renderTargetType == RENDERTARGETTYPE_FBO) {
    local_f8 = 0;
    pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar6->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x868))(0xd33,&local_f8);
    if (local_f8 < 0x100) {
      local_161 = 1;
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"GL_MAX_TEXTURE_SIZE must be at least ",&local_139);
      de::toString<int>(&local_160,&Stress::(anonymous_namespace)::TEST_CANVAS_SIZE);
      std::operator+(&local_118,&local_138,&local_160);
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_118);
      local_161 = 0;
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_2e8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  this_00 = tcu::MessageBuilder::operator<<(&local_2e8,(char (*) [22])"Creating test shader.");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2e8);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  local_449 = 1;
  pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_3b8);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&local_400);
  glu::VertexSource::VertexSource((VertexSource *)&local_3e0,&local_400);
  pPVar7 = glu::ProgramSources::operator<<(&local_3b8,&local_3e0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(&local_448);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_428,&local_448);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_428);
  glu::ShaderProgram::ShaderProgram(this_01,pRVar6,pPVar7);
  local_449 = 0;
  this->m_program = this_01;
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  glu::VertexSource::~VertexSource((VertexSource *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  glu::ProgramSources::~ProgramSources(&local_3b8);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar5,this->m_program);
  bVar1 = glu::ShaderProgram::isOk(this->m_program);
  if (bVar1) {
    return (int)CONCAT71(extraout_var,bVar1);
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"shader compile failed",&local_471);
  tcu::TestError::TestError(this_02,&local_470);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void RenderCase::init (void)
{
	const int width	 = m_context.getRenderTarget().getWidth();
	const int height = m_context.getRenderTarget().getHeight();

	// check target size
	if (m_renderTargetType == RENDERTARGETTYPE_SCREEN)
	{
		if (width < TEST_CANVAS_SIZE || height < TEST_CANVAS_SIZE)
			throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(TEST_CANVAS_SIZE) + "x" + de::toString(TEST_CANVAS_SIZE));
	}
	else if (m_renderTargetType == RENDERTARGETTYPE_FBO)
	{
		GLint maxTexSize = 0;
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTexSize);

		if (maxTexSize < TEST_CANVAS_SIZE)
			throw tcu::NotSupportedError(std::string("GL_MAX_TEXTURE_SIZE must be at least ") + de::toString(TEST_CANVAS_SIZE));
	}
	else
		DE_ASSERT(false);

	// gen shader

	m_testCtx.getLog() << tcu::TestLog::Message << "Creating test shader." << tcu::TestLog::EndMessage;

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(genVertexSource()) << glu::FragmentSource(genFragmentSource()));
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("shader compile failed");
}